

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O2

void divsufsortxx::tandemrepeat::
     introsort<std::stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>>,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long>
               (stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                *stack,iterator ISA,iterator ISAd,iterator SA,iterator first,iterator last,
               long *budget,int *chance,long size)

{
  long lVar1;
  BitmapArray<long> *pBVar2;
  iterator first1;
  iterator first1_00;
  iterator first2;
  long *plVar3;
  reference rhs;
  iterator last_00;
  iterator last_01;
  reference lhs;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  int extraout_var_04;
  undefined4 extraout_var_05;
  int extraout_var_06;
  undefined4 extraout_var_07;
  int extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  _Elt_pointer psVar6;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  pos_type *ppVar7;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  int extraout_var_25;
  undefined4 extraout_var_26;
  int extraout_var_27;
  undefined4 extraout_var_28;
  int extraout_var_29;
  undefined4 extraout_var_30;
  BitmapArray<long> *pBVar8;
  pos_type *ppVar9;
  pos_type pVar10;
  deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
  *pdVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  BitmapArray<long> *pBVar16;
  pos_type pVar17;
  long lVar18;
  iterator Td;
  iterator Td_00;
  iterator Td_01;
  iterator iVar19;
  iterator Td_02;
  iterator SA_00;
  iterator first_00;
  iterator first_01;
  iterator last_02;
  iterator first2_00;
  iterator last_03;
  ulong uVar20;
  BitmapArray<long> *in_stack_fffffffffffffec8;
  BitmapArray<long> *in_stack_fffffffffffffed0;
  iterator *in_stack_fffffffffffffed8;
  iterator local_108;
  ulong local_f0;
  iterator b;
  BitmapArray<long> *local_d0;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
  local_c8;
  deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
  *local_90;
  BitmapArray<long> *local_88;
  BitmapArray<long> *local_80;
  pos_type local_78;
  BitmapArray<long> *local_70;
  pos_type local_68;
  long *local_60;
  value_reference local_58;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  uVar12 = ISAd.pos_;
  pBVar8 = ISAd.array_;
  local_78 = ISA.pos_;
  local_80 = ISA.array_;
  local_108 = (iterator)ZEXT816(0);
  b.array_ = (BitmapArray<long> *)0x0;
  b.pos_ = 0;
  lVar14 = last.pos_ - first.pos_;
  local_90 = (deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
              *)stack;
  local_60 = budget;
LAB_0010cf5c:
  iVar5 = helper::lg<long>(lVar14);
  do {
    local_f0 = CONCAT44(local_f0._4_4_,iVar5);
LAB_0010cf65:
    ppVar9 = &first.pos_;
    uVar20 = local_f0 & 0xffffffff;
LAB_0010cf71:
    pVar10 = first.pos_;
    pBVar2 = first.array_;
    iVar5 = (int)uVar20;
    if (-1 < iVar5) {
      pVar10 = CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
      lVar14 = pVar10 - first.pos_;
      if (lVar14 < 9) {
        if (1 < lVar14) {
          last_03.array_._4_4_ = last.array_._4_4_;
          last_03.array_._0_4_ = last.array_._0_4_;
          iVar19.pos_ = uVar12;
          iVar19.array_ = pBVar8;
          first_01.pos_ = first.pos_;
          first_01.array_ = first.array_;
          last_03.pos_ = pVar10;
          helper::
          insertionsort<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                    (iVar19,first_01,last_03);
          goto LAB_0010dddf;
        }
        psVar6 = *(_Elt_pointer *)(local_90 + 0x30);
        if (psVar6 == *(_Elt_pointer *)(local_90 + 0x10)) {
          return;
        }
        if (psVar6 == *(_Elt_pointer *)(local_90 + 0x38)) {
          psVar6 = (*(_Map_pointer *)(local_90 + 0x48))[-1] + 9;
        }
        pBVar8 = psVar6[-1].m_a.array_;
        uVar12 = psVar6[-1].m_a.pos_;
        first.array_ = psVar6[-1].m_b.array_;
        first.pos_ = psVar6[-1].m_b.pos_;
        pBVar2 = psVar6[-1].m_c.array_;
        pVar10 = psVar6[-1].m_c.pos_;
        local_f0 = CONCAT44(local_f0._4_4_,psVar6[-1].m_d);
        last.array_._0_4_ = SUB84(pBVar2,0);
        last.array_._4_4_ = (undefined4)((ulong)pBVar2 >> 0x20);
        last.pos_._0_4_ = (undefined4)pVar10;
        last.pos_._4_4_ = (undefined4)(pVar10 >> 0x20);
        std::
        deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
        ::pop_back((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
                    *)local_90);
      }
      else {
        if (iVar5 == 0) break;
        last_02.array_._4_4_ = last.array_._4_4_;
        last_02.array_._0_4_ = last.array_._0_4_;
        Td_00.pos_ = uVar12;
        Td_00.array_ = pBVar8;
        first_00.pos_ = first.pos_;
        first_00.array_ = first.array_;
        last_02.pos_ = pVar10;
        local_f0._0_4_ = iVar5;
        local_108 = helper::
                    pivot<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                              (Td_00,first_00,last_02);
        lhs.pos_ = (pos_type)in_stack_fffffffffffffed8;
        lhs.array_ = in_stack_fffffffffffffed0;
        rhs.pos_ = (pos_type)in_stack_fffffffffffffec8;
        rhs.array_ = (BitmapArray<long> *)0x10d27a;
        bitmap::swap(lhs,rhs);
        pBVar2 = first.array_;
        first1.pos_ = first.pos_;
        first1.array_ = first.array_;
        pVar10 = first.pos_ + 1;
        local_48 = last.array_._0_4_;
        uStack_44 = last.array_._4_4_;
        uStack_40 = (undefined4)last.pos_;
        uStack_3c = last.pos_._4_4_;
        iVar5 = (*((first.array_)->super_Bitmap)._vptr_Bitmap[5])(first.array_,first.pos_);
        iVar5 = (*(pBVar8->super_Bitmap)._vptr_Bitmap[5])
                          (pBVar8,CONCAT44(extraout_var_10,iVar5) + uVar12);
        local_c8.m_a.array_ = (BitmapArray<long> *)CONCAT44(extraout_var_11,iVar5);
        in_stack_fffffffffffffec8 = (BitmapArray<long> *)CONCAT44(uStack_44,local_48);
        in_stack_fffffffffffffed0 = (BitmapArray<long> *)CONCAT44(uStack_3c,uStack_40);
        in_stack_fffffffffffffed8 = &local_108;
        last_00.pos_ = (pos_type)in_stack_fffffffffffffed0;
        last_00.array_ = in_stack_fffffffffffffec8;
        Td_01.pos_ = uVar12;
        Td_01.array_ = pBVar8;
        first2_00.pos_ = pVar10;
        first2_00.array_ = pBVar2;
        bVar4 = helper::
                partition<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                          (Td_01,first1,first2_00,last_00,in_stack_fffffffffffffed8,&b,
                           (value_type *)&local_c8);
        pVar10 = first.pos_;
        pBVar2 = first.array_;
        if (!bVar4) {
          iVar5 = (*((first.array_)->super_Bitmap)._vptr_Bitmap[5])(first.array_,first.pos_);
          local_c8.m_a.pos_ = CONCAT44(extraout_var_15,iVar5) + local_78;
          local_c8.m_a.array_ = local_80;
          iVar5 = (*(pBVar2->super_Bitmap)._vptr_Bitmap[5])(pBVar2,pVar10);
          local_58.pos_ = CONCAT44(extraout_var_16,iVar5) + uVar12;
          local_58.array_ = pBVar8;
          bVar4 = bitmap::BitmapArray<long>::value_reference::operator==
                            ((value_reference *)&local_c8,&local_58);
          if (bVar4) {
            local_f0._0_4_ = -1;
          }
          uVar12 = uVar12 + 1;
          lVar14 = (pVar10 - CONCAT44(last.pos_._4_4_,(undefined4)last.pos_)) + *local_60;
          *local_60 = lVar14;
          if (0 < lVar14) goto LAB_0010cf65;
          *local_60 = lVar14 + size;
          *chance = *chance + -1;
          pdVar11 = local_90;
          pVar17 = local_78;
          pBVar2 = local_80;
          if (*chance != 0) goto LAB_0010cf65;
          goto LAB_0010e1d1;
        }
        iVar5 = (*((local_108.array_)->super_Bitmap)._vptr_Bitmap[5])
                          (local_108.array_,local_108.pos_);
        local_c8.m_a.pos_ = CONCAT44(extraout_var_12,iVar5) + local_78;
        local_c8.m_a.array_ = local_80;
        iVar5 = (*((local_108.array_)->super_Bitmap)._vptr_Bitmap[5])
                          (local_108.array_,local_108.pos_);
        local_58.pos_ = CONCAT44(extraout_var_13,iVar5) + uVar12;
        local_58.array_ = pBVar8;
        bVar4 = bitmap::BitmapArray<long>::value_reference::operator==
                          ((value_reference *)&local_c8,&local_58);
        iVar5 = -1;
        if (!bVar4) {
          iVar5 = helper::lg<long>(b.pos_ - local_108.pos_);
        }
        pBVar16 = first.array_;
        local_70 = (BitmapArray<long> *)CONCAT44(local_70._4_4_,iVar5);
        local_f0 = CONCAT44(local_f0._4_4_,(int)local_f0 + -1);
        local_88 = (BitmapArray<long> *)~SA.pos_;
        lVar14 = local_108.pos_ + (long)local_88;
        local_68 = first.pos_;
        pVar10 = local_108.pos_;
        for (pVar17 = first.pos_; pVar17 < pVar10; pVar17 = pVar17 + 1) {
          iVar5 = (*(pBVar16->super_Bitmap)._vptr_Bitmap[5])(pBVar16,pVar17);
          (*(local_80->super_Bitmap)._vptr_Bitmap[4])
                    (local_80,CONCAT44(extraout_var_14,iVar5) + local_78,lVar14);
          pVar10 = local_108.pos_;
        }
        uVar20 = CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
        if (b.pos_ < uVar20) {
          pBVar2 = local_108.array_;
          local_88 = (BitmapArray<long> *)((long)local_88 + b.pos_);
          for (; pVar10 < b.pos_; pVar10 = pVar10 + 1) {
            iVar5 = (*(pBVar2->super_Bitmap)._vptr_Bitmap[5])(pBVar2,pVar10);
            (*(local_80->super_Bitmap)._vptr_Bitmap[4])
                      (local_80,CONCAT44(extraout_var_17,iVar5) + local_78,local_88);
          }
        }
        pVar10 = local_68;
        pdVar11 = local_90;
        lVar14 = (local_68 - uVar20) + *local_60;
        *local_60 = lVar14;
        if (lVar14 < 1) {
          *local_60 = lVar14 + size;
          *chance = *chance + -1;
          pVar17 = local_78;
          pBVar2 = local_80;
          if (*chance != 0) goto LAB_0010d56e;
          goto LAB_0010e1d1;
        }
LAB_0010d56e:
        lVar14 = local_108.pos_ - local_68;
        lVar18 = uVar20 - b.pos_;
        lVar13 = b.pos_ - local_108.pos_;
        iVar5 = (int)local_f0;
        if (lVar18 < lVar14) {
          if (lVar13 < lVar14) {
            if (lVar13 < lVar18) {
              local_c8.m_c.array_ = local_108.array_;
              local_c8.m_c.pos_ = local_108.pos_;
              local_c8.m_b.array_ = pBVar16;
              local_c8.m_b.pos_ = local_68;
              local_c8.m_d = (int)local_f0;
              local_c8.m_a.array_ = pBVar8;
              local_c8.m_a.pos_ = uVar12;
              std::
              deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
              ::
              emplace_back<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                        (local_90,&local_c8);
              local_c8.m_c.array_ =
                   (BitmapArray<long> *)CONCAT44(last.array_._4_4_,last.array_._0_4_);
              local_c8.m_c.pos_ = CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
              local_c8.m_b.array_ = b.array_;
              local_c8.m_b.pos_ = b.pos_;
              local_c8.m_d = (int)local_f0;
LAB_0010d8ff:
              local_c8.m_a.array_ = pBVar8;
              local_c8.m_a.pos_ = uVar12;
              std::
              deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
              ::
              emplace_back<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                        (pdVar11,&local_c8);
              uVar12 = uVar12 + 1;
              first.array_ = local_108.array_;
              first.pos_ = local_108.pos_;
              last.array_._0_4_ = SUB84(b.array_,0);
              last.array_._4_4_ = (undefined4)((ulong)b.array_ >> 0x20);
              ppVar7 = &b.pos_;
              ppVar9 = &last.pos_;
              local_f0 = CONCAT44(local_f0._4_4_,(int)local_70);
              goto LAB_0010ddc2;
            }
            local_c8.m_c.array_ = local_108.array_;
            local_c8.m_c.pos_ = local_108.pos_;
            local_c8.m_b.array_ = pBVar16;
            local_c8.m_b.pos_ = local_68;
            local_c8.m_d = (int)local_f0;
            local_c8.m_a.array_ = pBVar8;
            local_c8.m_a.pos_ = uVar12;
            std::
            deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
            ::
            emplace_back<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                      (local_90,&local_c8);
            local_c8.m_c.array_ = b.array_;
            local_c8.m_c.pos_ = b.pos_;
            local_c8.m_b.array_ = local_108.array_;
            local_c8.m_b.pos_ = local_108.pos_;
            local_c8.m_d = (int)local_70;
            local_c8.m_a.pos_ = uVar12 + 1;
          }
          else {
            local_c8.m_a.pos_ = uVar12 + 1;
            local_c8.m_c.array_ = b.array_;
            local_c8.m_c.pos_ = b.pos_;
            local_c8.m_b.array_ = local_108.array_;
            local_c8.m_b.pos_ = local_108.pos_;
            local_c8.m_d = (int)local_70;
            local_c8.m_a.array_ = pBVar8;
            std::
            deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
            ::
            emplace_back<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                      (local_90,&local_c8);
            local_c8.m_c.array_ = local_108.array_;
            local_c8.m_c.pos_ = local_108.pos_;
            local_c8.m_b.array_ = pBVar16;
            local_c8.m_b.pos_ = pVar10;
            local_c8.m_d = (int)local_f0;
            local_c8.m_a.pos_ = uVar12;
          }
          local_c8.m_a.array_ = pBVar8;
          std::
          deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
          ::
          emplace_back<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                    (pdVar11,&local_c8);
          first.array_ = b.array_;
          ppVar7 = &b.pos_;
        }
        else {
          if (lVar13 < lVar18) {
            local_c8.m_b.pos_ = b.pos_;
            if (lVar13 < lVar14) {
              local_c8.m_c.array_ =
                   (BitmapArray<long> *)CONCAT44(last.array_._4_4_,last.array_._0_4_);
              local_c8.m_c.pos_ = CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
              local_c8.m_b.array_ = b.array_;
              local_c8.m_d = (int)local_f0;
              local_c8.m_a.array_ = pBVar8;
              local_c8.m_a.pos_ = uVar12;
              std::
              deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
              ::
              emplace_back<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                        (local_90,&local_c8);
              local_c8.m_c.array_ = local_108.array_;
              local_c8.m_c.pos_ = local_108.pos_;
              local_c8.m_b.array_ = pBVar16;
              local_c8.m_b.pos_ = local_68;
              local_c8.m_d = iVar5;
              goto LAB_0010d8ff;
            }
            local_c8.m_c.array_ = (BitmapArray<long> *)CONCAT44(last.array_._4_4_,last.array_._0_4_)
            ;
            local_c8.m_c.pos_ = CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
            local_c8.m_b.array_ = b.array_;
            local_c8.m_d = (int)local_f0;
            local_c8.m_a.array_ = pBVar8;
            local_c8.m_a.pos_ = uVar12;
            std::
            deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
            ::
            emplace_back<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                      (local_90,&local_c8);
            local_c8.m_a.pos_ = uVar12 + 1;
            local_c8.m_c.array_ = b.array_;
            local_c8.m_c.pos_ = b.pos_;
            local_c8.m_b.array_ = local_108.array_;
            local_c8.m_b.pos_ = local_108.pos_;
            local_c8.m_d = (int)local_70;
            local_c8.m_a.array_ = pBVar8;
            std::
            deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
            ::
            emplace_back<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                      (pdVar11,&local_c8);
            last.array_._0_4_ = local_108.array_._0_4_;
            last.array_._4_4_ = local_108.array_._4_4_;
          }
          else {
            local_c8.m_a.pos_ = uVar12 + 1;
            local_c8.m_c.array_ = b.array_;
            local_c8.m_c.pos_ = b.pos_;
            local_c8.m_b.array_ = local_108.array_;
            local_c8.m_b.pos_ = local_108.pos_;
            local_c8.m_d = (int)local_70;
            local_c8.m_a.array_ = pBVar8;
            std::
            deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
            ::
            emplace_back<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                      (local_90,&local_c8);
            local_c8.m_c.array_ = (BitmapArray<long> *)CONCAT44(last.array_._4_4_,last.array_._0_4_)
            ;
            local_c8.m_c.pos_ = CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
            local_c8.m_b.array_ = b.array_;
            local_c8.m_b.pos_ = b.pos_;
            local_c8.m_d = (int)local_f0;
            local_c8.m_a.array_ = pBVar8;
            local_c8.m_a.pos_ = uVar12;
            std::
            deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
            ::
            emplace_back<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                      (pdVar11,&local_c8);
            last.array_._0_4_ = local_108.array_._0_4_;
            last.array_._4_4_ = local_108.array_._4_4_;
          }
          ppVar7 = &local_108.pos_;
          ppVar9 = &last.pos_;
        }
LAB_0010ddc2:
        *ppVar9 = *ppVar7;
      }
      goto LAB_0010cf65;
    }
    if (iVar5 == -2) {
      psVar6 = *(_Elt_pointer *)(local_90 + 0x30);
      if (psVar6 == *(_Elt_pointer *)(local_90 + 0x38)) {
        psVar6 = (*(_Map_pointer *)(local_90 + 0x48))[-1] + 9;
      }
      pBVar8 = psVar6[-1].m_b.array_;
      local_d0 = (BitmapArray<long> *)psVar6[-1].m_b.pos_;
      iVar19 = psVar6[-1].m_b;
      pBVar2 = psVar6[-1].m_c.array_;
      pVar10 = psVar6[-1].m_c.pos_;
      std::
      deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
      ::pop_back((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
                  *)local_90);
      lVar14 = uVar12 - local_78;
      local_68 = SA.pos_;
      local_f0 = ~SA.pos_ + pVar10;
      local_70 = first.array_;
      pBVar16 = first.array_;
      local_108 = iVar19;
      b.array_ = pBVar2;
      b.pos_ = pVar10;
      local_88 = pBVar8;
      for (pVar17 = first.pos_; pVar17 < local_d0; pVar17 = pVar17 + 1) {
        iVar5 = (*(pBVar16->super_Bitmap)._vptr_Bitmap[5])(pBVar16,pVar17);
        pBVar8 = local_80;
        lVar13 = CONCAT44(extraout_var_18,iVar5) - lVar14;
        if (-1 < lVar13) {
          lVar18 = lVar13 + local_78;
          iVar5 = (*(local_80->super_Bitmap)._vptr_Bitmap[5])(local_80,lVar18);
          if (CONCAT44(extraout_var_19,iVar5) == local_f0) {
            (*(pBVar8->super_Bitmap)._vptr_Bitmap[4])(pBVar8,lVar18,(long)local_d0 - local_68);
            pBVar16 = local_70;
            (*(local_88->super_Bitmap)._vptr_Bitmap[4])(local_88,local_d0,lVar13);
            local_d0 = (BitmapArray<long> *)((long)local_d0 + 1);
          }
        }
      }
      plVar3 = (long *)CONCAT44(last.array_._4_4_,last.array_._0_4_);
      lVar13 = CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
      local_70 = b.array_;
      local_88 = (BitmapArray<long> *)b.pos_;
      while (lVar13 = lVar13 + -1, local_d0 < local_88) {
        lVar18 = (**(code **)(*plVar3 + 0x28))(plVar3,lVar13);
        lVar18 = lVar18 - lVar14;
        if (-1 < lVar18) {
          lVar1 = lVar18 + local_78;
          iVar5 = (*(local_80->super_Bitmap)._vptr_Bitmap[5])(local_80,lVar1);
          if (CONCAT44(extraout_var_20,iVar5) == local_f0) {
            local_88 = (BitmapArray<long> *)((long)local_88 - 1);
            (*(local_70->super_Bitmap)._vptr_Bitmap[4])(local_70,local_88,lVar18);
            (*(local_80->super_Bitmap)._vptr_Bitmap[4])(local_80,lVar1,(long)local_88 - local_68);
          }
        }
      }
      psVar6 = *(_Elt_pointer *)(local_90 + 0x30);
      if (psVar6 == *(_Elt_pointer *)(local_90 + 0x10)) {
        return;
      }
LAB_0010d965:
      if (psVar6 == *(_Elt_pointer *)(local_90 + 0x38)) {
        psVar6 = (*(_Map_pointer *)(local_90 + 0x48))[-1] + 9;
      }
      pBVar8 = psVar6[-1].m_a.array_;
      uVar12 = psVar6[-1].m_a.pos_;
      first.array_ = psVar6[-1].m_b.array_;
      first.pos_ = psVar6[-1].m_b.pos_;
      pBVar2 = psVar6[-1].m_c.array_;
      pVar10 = psVar6[-1].m_c.pos_;
      local_f0 = CONCAT44(local_f0._4_4_,psVar6[-1].m_d);
      last.array_._0_4_ = SUB84(pBVar2,0);
      last.array_._4_4_ = (undefined4)((ulong)pBVar2 >> 0x20);
      last.pos_._0_4_ = (undefined4)pVar10;
      last.pos_._4_4_ = (undefined4)(pVar10 >> 0x20);
      std::
      deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
      ::pop_back((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
                  *)local_90);
      goto LAB_0010cf65;
    }
    if (iVar5 == -1) goto LAB_0010de52;
    local_d0 = first.array_;
    (*((first.array_)->super_Bitmap)._vptr_Bitmap[5])(first.array_,first.pos_);
    uVar20 = CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
    if (-1 < extraout_var_04) {
      local_108.pos_ = pVar10;
      local_108.array_ = pBVar2;
      do {
        lVar14 = local_108.pos_ - SA.pos_;
        iVar5 = (*((local_108.array_)->super_Bitmap)._vptr_Bitmap[5])();
        (*(local_80->super_Bitmap)._vptr_Bitmap[4])
                  (local_80,CONCAT44(extraout_var_05,iVar5) + local_78,lVar14);
        pVar10 = local_108.pos_ + 1;
        local_108.pos_ = pVar10;
        if (uVar20 <= pVar10) goto LAB_0010d0f4;
        (*((local_108.array_)->super_Bitmap)._vptr_Bitmap[5])(local_108.array_,pVar10);
      } while (-1 < extraout_var_06);
      pVar10 = local_108.pos_;
LAB_0010d0f4:
      local_d0 = local_108.array_;
      first.array_ = local_108.array_;
      first.pos_ = pVar10;
    }
    if (uVar20 <= pVar10) {
      psVar6 = *(_Elt_pointer *)(local_90 + 0x30);
      if (psVar6 == *(_Elt_pointer *)(local_90 + 0x10)) {
        return;
      }
      goto LAB_0010d965;
    }
    local_108.array_ = local_d0;
    local_88 = (BitmapArray<long> *)uVar20;
    local_68 = pVar10 - uVar20;
    local_108.pos_ = pVar10;
    do {
      iVar5 = (*((local_108.array_)->super_Bitmap)._vptr_Bitmap[5])(local_108.array_,local_108.pos_)
      ;
      (*((local_108.array_)->super_Bitmap)._vptr_Bitmap[4])
                (local_108.array_,local_108.pos_,~CONCAT44(extraout_var_07,iVar5));
      local_108.pos_ = local_108.pos_ + 1;
      (*((local_108.array_)->super_Bitmap)._vptr_Bitmap[5])();
      pVar17 = local_108.pos_;
    } while (extraout_var_08 < 0);
    local_108.pos_ = local_108.pos_ + 1;
    if (local_108.pos_ < local_88) {
      uVar20 = local_108.pos_;
      for (uVar15 = pVar10; uVar15 < uVar20; uVar15 = uVar15 + 1) {
        iVar5 = (*(local_d0->super_Bitmap)._vptr_Bitmap[5])(local_d0,uVar15);
        (*(local_80->super_Bitmap)._vptr_Bitmap[4])
                  (local_80,CONCAT44(extraout_var_09,iVar5) + local_78,pVar17 - SA.pos_);
        uVar20 = local_108.pos_;
      }
    }
    iVar5 = (*(local_d0->super_Bitmap)._vptr_Bitmap[5])(local_d0,pVar10);
    local_c8.m_a.pos_ = CONCAT44(extraout_var_21,iVar5) + local_78;
    local_c8.m_a.array_ = local_80;
    iVar5 = (*(local_d0->super_Bitmap)._vptr_Bitmap[5])(local_d0,pVar10);
    local_58.pos_ = CONCAT44(extraout_var_22,iVar5) + uVar12;
    local_58.array_ = pBVar8;
    bVar4 = bitmap::BitmapArray<long>::value_reference::operator==
                      ((value_reference *)&local_c8,&local_58);
    iVar5 = -1;
    if (!bVar4) {
      iVar5 = helper::lg<long>(local_108.pos_ - pVar10);
    }
    local_f0 = CONCAT44(local_f0._4_4_,iVar5);
    lVar14 = local_68 + *local_60;
    *local_60 = lVar14;
    if (lVar14 < 1) {
      *local_60 = lVar14 + size;
      *chance = *chance + -1;
      pdVar11 = local_90;
      pVar17 = local_78;
      pBVar2 = local_80;
      if (*chance == 0) goto LAB_0010e1d1;
    }
    if ((long)((long)local_88 - local_108.pos_) < (long)(local_108.pos_ - pVar10)) {
      if (local_108.pos_ < local_88) {
        local_c8.m_a.pos_ = uVar12 + 1;
        local_c8.m_c.array_ = local_108.array_;
        local_c8.m_c.pos_ = local_108.pos_;
        local_c8.m_b.array_ = local_d0;
        local_c8.m_a.array_ = pBVar8;
        local_c8.m_b.pos_ = pVar10;
        local_c8.m_d = iVar5;
        std::
        deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
        ::
        emplace_back<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                  (local_90,&local_c8);
        first.array_ = local_108.array_;
        first.pos_ = local_108.pos_;
        goto LAB_0010dddf;
      }
      uVar12 = uVar12 + 1;
      last.array_._0_4_ = local_108.array_._0_4_;
      last.array_._4_4_ = local_108.array_._4_4_;
      last.pos_._0_4_ = (undefined4)local_108.pos_;
      last.pos_._4_4_ = local_108.pos_._4_4_;
      goto LAB_0010cf65;
    }
    if (pVar10 < local_108.pos_) {
      local_c8.m_c.array_ = (BitmapArray<long> *)CONCAT44(last.array_._4_4_,last.array_._0_4_);
      local_c8.m_c.pos_ = CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
      local_c8.m_b.array_ = local_108.array_;
      local_c8.m_b.pos_ = local_108.pos_;
      local_c8.m_d = -3;
      local_c8.m_a.array_ = pBVar8;
      local_c8.m_a.pos_ = uVar12;
      std::
      deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
      ::
      emplace_back<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                (local_90,&local_c8);
      uVar12 = uVar12 + 1;
      last.array_._0_4_ = local_108.array_._0_4_;
      last.array_._4_4_ = local_108.array_._4_4_;
      last.pos_._0_4_ = (undefined4)local_108.pos_;
      last.pos_._4_4_ = local_108.pos_._4_4_;
      goto LAB_0010cf65;
    }
    first.array_ = local_108.array_;
    first.pos_ = local_108.pos_;
LAB_0010dddf:
    iVar5 = -3;
  } while( true );
  Td.pos_ = uVar12;
  Td.array_ = pBVar8;
  SA_00.pos_ = first.pos_;
  SA_00.array_ = first.array_;
  helper::heapsort<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
            (Td,SA_00,lVar14);
  local_108.pos_ = CONCAT44(last.pos_._4_4_,(undefined4)last.pos_) - 1;
  local_108.array_ = (BitmapArray<long> *)CONCAT44(last.array_._4_4_,last.array_._0_4_);
  iVar5 = (*(((BitmapArray<long> *)CONCAT44(last.array_._4_4_,last.array_._0_4_))->super_Bitmap).
            _vptr_Bitmap[5])();
  iVar5 = (*(pBVar8->super_Bitmap)._vptr_Bitmap[5])(pBVar8,CONCAT44(extraout_var,iVar5) + uVar12);
  lVar14 = CONCAT44(extraout_var_00,iVar5);
  while (lVar13 = lVar14, first.pos_ < local_108.pos_) {
    local_108.pos_ = local_108.pos_ - 1;
    iVar5 = (*((local_108.array_)->super_Bitmap)._vptr_Bitmap[5])();
    iVar5 = (*(pBVar8->super_Bitmap)._vptr_Bitmap[5])
                      (pBVar8,CONCAT44(extraout_var_01,iVar5) + uVar12);
    lVar14 = CONCAT44(extraout_var_02,iVar5);
    if (CONCAT44(extraout_var_02,iVar5) == lVar13) {
      iVar5 = (*((local_108.array_)->super_Bitmap)._vptr_Bitmap[5])(local_108.array_,local_108.pos_)
      ;
      (*((local_108.array_)->super_Bitmap)._vptr_Bitmap[4])
                (local_108.array_,local_108.pos_,~CONCAT44(extraout_var_03,iVar5));
      lVar14 = lVar13;
    }
  }
  uVar20 = 0xfffffffffffffffd;
  goto LAB_0010cf71;
LAB_0010e1d1:
  psVar6 = *(_Elt_pointer *)(pdVar11 + 0x30);
  if (psVar6 == *(_Elt_pointer *)(pdVar11 + 0x10)) {
    return;
  }
  if (psVar6 == *(_Elt_pointer *)(pdVar11 + 0x38)) {
    psVar6 = (*(_Map_pointer *)(pdVar11 + 0x48))[-1] + 9;
  }
  if (psVar6[-1].m_d == -3) {
    uVar12 = psVar6[-1].m_c.pos_;
    uVar20 = psVar6[-1].m_b.pos_;
    local_108.array_ = psVar6[-1].m_b.array_;
    while( true ) {
      local_108.pos_ = uVar20;
      if (uVar12 <= uVar20) break;
      (*((local_108.array_)->super_Bitmap)._vptr_Bitmap[5])();
      uVar20 = local_108.pos_;
      if (-1 < extraout_var_25) {
        b.array_ = local_108.array_;
        b.pos_ = local_108.pos_;
        do {
          lVar14 = local_108.pos_ - SA.pos_;
          iVar5 = (*((local_108.array_)->super_Bitmap)._vptr_Bitmap[5])();
          (*(pBVar2->super_Bitmap)._vptr_Bitmap[4])
                    (pBVar2,CONCAT44(extraout_var_26,iVar5) + pVar17,lVar14);
          uVar20 = local_108.pos_ + 1;
          local_108.pos_ = uVar20;
          if (uVar12 <= uVar20) goto LAB_0010e28b;
          (*((local_108.array_)->super_Bitmap)._vptr_Bitmap[5])();
        } while (-1 < extraout_var_27);
        uVar20 = local_108.pos_;
LAB_0010e28b:
        if (uVar12 <= uVar20) break;
      }
      b.array_ = local_108.array_;
      b.pos_ = uVar20;
      do {
        iVar5 = (*((local_108.array_)->super_Bitmap)._vptr_Bitmap[5])
                          (local_108.array_,local_108.pos_);
        (*((local_108.array_)->super_Bitmap)._vptr_Bitmap[4])
                  (local_108.array_,local_108.pos_,~CONCAT44(extraout_var_28,iVar5));
        local_108.pos_ = local_108.pos_ + 1;
        (*((local_108.array_)->super_Bitmap)._vptr_Bitmap[5])();
      } while (extraout_var_29 < 0);
      lVar14 = local_108.pos_ - SA.pos_;
      do {
        iVar5 = (*((b.array_)->super_Bitmap)._vptr_Bitmap[5])(b.array_,b.pos_);
        (*(pBVar2->super_Bitmap)._vptr_Bitmap[4])
                  (pBVar2,CONCAT44(extraout_var_30,iVar5) + pVar17,lVar14);
        b.pos_ = b.pos_ + 1;
      } while (b.pos_ <= local_108.pos_);
      uVar20 = local_108.pos_ + 1;
    }
  }
  pdVar11 = local_90;
  std::
  deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
  ::pop_back((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
              *)local_90);
  goto LAB_0010e1d1;
LAB_0010de52:
  local_88 = (BitmapArray<long> *)(uVar12 - 1);
  first2.pos_ = first.pos_;
  first2.array_ = first.array_;
  first1_00.pos_ = first.pos_;
  first1_00.array_ = first.array_;
  local_c8.m_a.array_ =
       (BitmapArray<long> *)(~SA.pos_ + CONCAT44(last.pos_._4_4_,(undefined4)last.pos_));
  in_stack_fffffffffffffec8 = (BitmapArray<long> *)CONCAT44(last.array_._4_4_,last.array_._0_4_);
  in_stack_fffffffffffffed0 = (BitmapArray<long> *)CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
  in_stack_fffffffffffffed8 = &local_108;
  last_01.pos_ = (pos_type)in_stack_fffffffffffffed0;
  last_01.array_ = in_stack_fffffffffffffec8;
  Td_02.pos_ = (pos_type)local_88;
  Td_02.array_ = pBVar8;
  helper::partition<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
            (Td_02,first1_00,first2,last_01,in_stack_fffffffffffffed8,&b,(value_type *)&local_c8);
  pBVar2 = first.array_;
  local_f0 = CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
  pVar10 = local_108.pos_;
  if (local_108.pos_ < local_f0) {
    lVar14 = ~SA.pos_ + local_108.pos_;
    for (pVar17 = first.pos_; pVar10 = local_108.pos_, pVar17 < local_108.pos_; pVar17 = pVar17 + 1)
    {
      iVar5 = (*(pBVar2->super_Bitmap)._vptr_Bitmap[5])(pBVar2,pVar17);
      (*(local_80->super_Bitmap)._vptr_Bitmap[4])
                (local_80,CONCAT44(extraout_var_23,iVar5) + local_78,lVar14);
    }
  }
  pBVar2 = local_108.array_;
  if (b.pos_ < local_f0) {
    lVar14 = ~SA.pos_ + b.pos_;
    for (; pVar10 < b.pos_; pVar10 = pVar10 + 1) {
      iVar5 = (*(pBVar2->super_Bitmap)._vptr_Bitmap[5])(pBVar2,pVar10);
      (*(local_80->super_Bitmap)._vptr_Bitmap[4])
                (local_80,CONCAT44(extraout_var_24,iVar5) + local_78,lVar14);
    }
    pVar10 = local_108.pos_;
  }
  pdVar11 = local_90;
  local_c8.m_c.array_ = b.array_;
  local_c8.m_c.pos_ = b.pos_;
  local_c8.m_d = 0;
  local_c8.m_a.array_ = pBVar8;
  local_c8.m_a.pos_ = uVar12;
  local_c8.m_b.array_ = local_108.array_;
  local_c8.m_b.pos_ = pVar10;
  std::
  deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
  ::
  emplace_back<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
            (local_90,&local_c8);
  pVar10 = first.pos_;
  pBVar2 = first.array_;
  local_c8.m_c.array_ = (BitmapArray<long> *)CONCAT44(last.array_._4_4_,last.array_._0_4_);
  local_c8.m_c.pos_ = CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
  local_c8.m_a.pos_ = (pos_type)local_88;
  local_c8.m_b.array_ = first.array_;
  local_c8.m_b.pos_ = first.pos_;
  local_c8.m_d = -2;
  local_c8.m_a.array_ = pBVar8;
  std::
  deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
  ::
  emplace_back<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
            (pdVar11,&local_c8);
  pVar17 = b.pos_;
  pBVar16 = b.array_;
  if ((long)(local_f0 - b.pos_) < (long)(local_108.pos_ - pVar10)) {
    if (b.pos_ < local_f0) {
      local_58.array_ = local_108.array_;
      local_58.pos_ = local_108.pos_;
      local_c8.m_d = helper::lg<long>(local_108.pos_ - pVar10);
      local_c8.m_b.array_ = pBVar2;
      local_c8.m_b.pos_ = pVar10;
      local_c8.m_c.array_ = local_58.array_;
      local_c8.m_c.pos_ = local_58.pos_;
      local_c8.m_a.array_ = pBVar8;
      local_c8.m_a.pos_ = uVar12;
      std::
      deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
      ::
      emplace_back<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                (local_90,&local_c8);
      first.array_ = b.array_;
      first.pos_ = b.pos_;
      pVar10 = b.pos_;
      pVar17 = local_f0;
    }
    else {
      last.array_._0_4_ = local_108.array_._0_4_;
      last.array_._4_4_ = local_108.array_._4_4_;
      last.pos_._0_4_ = (undefined4)local_108.pos_;
      last.pos_._4_4_ = local_108.pos_._4_4_;
      pVar17 = local_108.pos_;
    }
  }
  else if (pVar10 < local_108.pos_) {
    local_58.array_ = (BitmapArray<long> *)CONCAT44(last.array_._4_4_,last.array_._0_4_);
    local_58.pos_ = CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
    local_c8.m_d = helper::lg<long>(local_f0 - b.pos_);
    local_c8.m_b.array_ = pBVar16;
    local_c8.m_b.pos_ = pVar17;
    local_c8.m_c.array_ = local_58.array_;
    local_c8.m_c.pos_ = local_58.pos_;
    local_c8.m_a.array_ = pBVar8;
    local_c8.m_a.pos_ = uVar12;
    std::
    deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
    ::
    emplace_back<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
              (local_90,&local_c8);
    last.array_._0_4_ = local_108.array_._0_4_;
    last.array_._4_4_ = local_108.array_._4_4_;
    last.pos_._0_4_ = (undefined4)local_108.pos_;
    last.pos_._4_4_ = local_108.pos_._4_4_;
    pVar17 = local_108.pos_;
  }
  else {
    first.array_ = b.array_;
    first.pos_ = b.pos_;
    pVar10 = b.pos_;
    pVar17 = local_f0;
  }
  lVar14 = pVar17 - pVar10;
  goto LAB_0010cf5c;
}

Assistant:

void introsort(stack_type &stack, ISAIterator_type ISA, ISAIterator_type ISAd,
               const SAIterator_type SA, SAIterator_type first,
               SAIterator_type last, pos_type &budget, int &chance,
               pos_type size) {
  typedef typename std::iterator_traits<ISAIterator_type>::value_type value_type;
  typedef typename stack_type::value_type stackinfo_type;
#define UPDATE_BUDGET(n)\
  {\
    budget -= (n);\
    if(budget <= 0) {\
      budget += size;\
      if(--chance == 0) { break; }\
    }\
  }

  SAIterator_type a, b, c, d, e;
  pos_type s, t;
  value_type v, x;
  int limit, next;

  for (limit = helper::lg(last - first);;) {

    if (limit < 0) {
      if (limit == -1) {
        /* tandem repeat partition */
        helper::partition(ISAd - 1, first, first, last, a, b, last - SA - 1);

        /* update ranks */
        if (a < last) {
          for (c = first, v = a - SA - 1; c < a; ++c) {
            ISA[*c] = v;
          }
        }
        if (b < last) {
          for (c = a, v = b - SA - 1; c < b; ++c) {
            ISA[*c] = v;
          }
        }

        /* push */
        STACK_PUSH4(ISAd, a, b, 0);
        STACK_PUSH4(ISAd - 1, first, last, -2);
        if ((a - first) <= (last - b)) {
          if (first < a) {
            STACK_PUSH4(ISAd, b, last, helper::lg(last - b));
            last = a;
          } else {
            first = b;
          }
        } else {
          if (b < last) {
            STACK_PUSH4(ISAd, first, a, helper::lg(a - first));
            first = b;
          } else {
            last = a;
          }
        }
        limit = helper::lg(last - first);
      } else if (limit == -2) {
        /* tandem repeat copy */
        stackinfo_type temp = stack.top();
        stack.pop();
        a = temp.m_b, b = temp.m_c;
        t = ISAd - ISA;
        v = b - SA - 1;
        for (c = first, d = a; c < d; ++c) {
          if ((0 <= (s = *c - t)) && (ISA[s] == v)) {
            ISA[s] = d - SA;
            *d++ = s;
          }
        }
        for (c = last - 1, e = d, d = b; e < d; --c) {
          if ((0 <= (s = *c - t)) && (ISA[s] == v)) {
            *--d = s;
            ISA[s] = d - SA;
          }
        }
        STACK_POP4(ISAd, first, last, limit);
      } else {
        /* sorted partition */
        if (0 <= *first) {
          a = first;
          do {
            ISA[*a] = a - SA;
          } while ((++a < last) && (0 <= *a));
          first = a;
        }
        if (first < last) {
          a = first;
          do {
            *a = ~*a;
          } while (*++a < 0);
          ++a;
          if (a < last) {
            for (c = first, v = a - SA - 1; c < a; ++c) {
              ISA[*c] = v;
            }
          }

          /* push */
          next = (ISA[*first] == ISAd[*first]) ? -1 : helper::lg(a - first);
          UPDATE_BUDGET(last - first);
          if ((a - first) <= (last - a)) {
            if (first < a) {
              STACK_PUSH4(ISAd, a, last, -3);
              ISAd += 1, last = a, limit = next;
            } else {
              first = a, limit = -3;
            }
          } else {
            if (a < last) {
              STACK_PUSH4(ISAd + 1, first, a, next);
              first = a, limit = -3;
            } else {
              ISAd += 1, last = a, limit = next;
            }
          }
        } else {
          STACK_POP4(ISAd, first, last, limit);
        }
      }
      continue;
    }

    if ((last - first) <= 8) {
      if (1 < (last - first)) {
        helper::insertionsort(ISAd, first, last);
        limit = -3;
      } else {
        STACK_POP4(ISAd, first, last, limit);
      }
      continue;
    }

    if (limit-- == 0) {
      helper::heapsort(ISAd, first, last - first);
      for (a = last - 1, v = ISAd[*a]; first < a;) {
        if ((x = ISAd[*--a]) == v) {
          *a = ~*a;
        } else {
          v = x;
        }
      }
      limit = -3;
      continue;
    }

    a = helper::pivot(ISAd, first, last);
    std::iter_swap(first, a);
    if (helper::partition(ISAd, first, first + 1, last, a, b, ISAd[*first])
        != false) {
      next = (ISA[*a] == ISAd[*a]) ? -1 : helper::lg(b - a);

      /* update ranks */
      for (c = first, v = a - SA - 1; c < a; ++c) {
        ISA[*c] = v;
      }
      if (b < last) {
        for (c = a, v = b - SA - 1; c < b; ++c) {
          ISA[*c] = v;
        }
      }

      /* push */
      UPDATE_BUDGET(last - first);
      if ((a - first) <= (last - b)) {
        if ((last - b) <= (b - a)) {
          STACK_PUSH4(ISAd + 1, a, b, next);
          STACK_PUSH4(ISAd, b, last, limit);
          last = a;
        } else if ((a - first) <= (b - a)) {
          STACK_PUSH4(ISAd, b, last, limit);
          STACK_PUSH4(ISAd + 1, a, b, next);
          last = a;
        } else {
          STACK_PUSH4(ISAd, b, last, limit);
          STACK_PUSH4(ISAd, first, a, limit);
          ISAd += 1, first = a, last = b, limit = next;
        }
      } else {
        if ((a - first) <= (b - a)) {
          STACK_PUSH4(ISAd + 1, a, b, next);
          STACK_PUSH4(ISAd, first, a, limit);
          first = b;
        } else if ((last - b) <= (b - a)) {
          STACK_PUSH4(ISAd, first, a, limit);
          STACK_PUSH4(ISAd + 1, a, b, next);
          first = b;
        } else {
          STACK_PUSH4(ISAd, first, a, limit);
          STACK_PUSH4(ISAd, b, last, limit);
          ISAd += 1, first = a, last = b, limit = next;
        }
      }
    } else {
      limit = (ISA[*first] == ISAd[*first]) ? -1 : (limit + 1), ISAd += 1;
      UPDATE_BUDGET(last - first);
    }
  }

  for (; stack.empty() == false; stack.pop()) {
    stackinfo_type temp = stack.top();
    if (temp.m_d == -3) {
      first = temp.m_b, last = temp.m_c;
      for (a = first; a < last; ++a) {
        if (0 <= *a) {
          b = a;
          do {
            ISA[*a] = a - SA;
          } while ((++a < last) && (0 <= *a));
          if (last <= a) {
            break;
          }
        }
        b = a;
        do {
          *a = ~*a;
        } while (*++a < 0);
        v = a - SA;
        do {
          ISA[*b] = v;
        } while (++b <= a);
      }
    }
  }
#undef UPDATE_BUDGET
}